

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDFOutlineDocumentHelper *this,QPDF *qpdf)

{
  element_type *this_00;
  bool bVar1;
  Members *this_01;
  QPDFObjGen og;
  allocator<char> local_e9;
  QPDFObjectHandle outlines;
  QPDFOutlineObjectHelper local_d8;
  QPDFObjectHandle root;
  QPDFObjectHandle cur;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  set seen;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFOutlineDocumentHelper_002adba0;
  this_01 = (Members *)operator_new(0x98);
  memset(this_01,0,0x98);
  Members::Members(this_01);
  std::__shared_ptr<QPDFOutlineDocumentHelper::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFOutlineDocumentHelper::Members,void>
            ((__shared_ptr<QPDFOutlineDocumentHelper::Members,(__gnu_cxx::_Lock_policy)2> *)&this->m
             ,this_01);
  QPDF::getRoot((QPDF *)&root);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"/Outlines",(allocator<char> *)&seen);
  bVar1 = QPDFObjectHandle::hasKey(&root,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"/Outlines",(allocator<char> *)&seen);
    QPDFObjectHandle::getKey(&outlines,(string *)&root);
    std::__cxx11::string::~string((string *)&local_d8);
    bVar1 = QPDFObjectHandle::isDictionary(&outlines);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"/First",(allocator<char> *)&seen);
      bVar1 = QPDFObjectHandle::hasKey(&outlines,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"/First",(allocator<char> *)&seen);
        QPDFObjectHandle::getKey(&cur,(string *)&outlines);
        std::__cxx11::string::~string((string *)&local_d8);
        seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_left =
             &seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
              _M_impl.super__Rb_tree_header._M_header;
        seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_color = _S_red;
        seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_node_count = 0;
        seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_right =
             seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
             _M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          bVar1 = QPDFObjectHandle::isNull(&cur);
          if (bVar1) break;
          og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&cur);
          bVar1 = QPDFObjGen::set::add(&seen,og);
          if (!bVar1) break;
          this_00 = (this->m).
                    super___shared_ptr<QPDFOutlineDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur);
          QPDFOutlineObjectHelper::Accessor::create(&local_d8,(QPDFObjectHandle *)&local_80,this,1);
          std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::
          emplace_back<QPDFOutlineObjectHelper>(&this_00->outlines,&local_d8);
          QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(&local_d8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"/Next",&local_e9);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_40,(string *)&cur);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur,&local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        std::
        _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
        ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                     *)&seen);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cur.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&outlines.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    QPDFObjectHandle root = qpdf.getRoot();
    if (!root.hasKey("/Outlines")) {
        return;
    }
    QPDFObjectHandle outlines = root.getKey("/Outlines");
    if (!(outlines.isDictionary() && outlines.hasKey("/First"))) {
        return;
    }
    QPDFObjectHandle cur = outlines.getKey("/First");
    QPDFObjGen::set seen;
    while (!cur.isNull() && seen.add(cur)) {
        m->outlines.push_back(QPDFOutlineObjectHelper::Accessor::create(cur, *this, 1));
        cur = cur.getKey("/Next");
    }
}